

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O3

void * ThreadEntry(void *param)

{
  long lVar1;
  
  pthread_setspecific(tlsKey,param);
  osEvent::Notify((osEvent *)((long)param + 0x18));
  (**(code **)((long)param + 8))(*(undefined8 *)((long)param + 0x10));
  lVar1 = 0;
  do {
    if (*(void **)((long)Threads + lVar1) == param) {
      *(undefined8 *)((long)Threads + lVar1) = 0;
      return (void *)0x0;
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x180);
  return (void *)0x0;
}

Assistant:

static void* ThreadEntry(void* param)
{
    osThread* thread = (osThread*)param;
    pthread_setspecific(tlsKey, thread); // Thread Local Storage points to osThread
    thread->ThreadStart.Notify();
    thread->Entry(thread->Param);

    // Now remove self from active thread list
    for (int i = 0; i < MAX_THREADS; i++)
    {
        if (Threads[i] == thread)
        {
            Threads[i] = nullptr;
            break;
        }
    }

    return nullptr;
}